

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdUnblindTxOut(void *handle,char *tx_hex_string,uint32_t tx_out_index,char *blinding_key,
                   char **asset,int64_t *value,char **asset_blind_factor,char **value_blind_factor)

{
  bool bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  char *in_RCX;
  char *in_RSI;
  undefined8 *in_R8;
  int64_t *in_R9;
  Amount AVar4;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  UnblindParameter unblind_data;
  ConfidentialTransactionController ctxc;
  char *work_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  Privkey *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  uint32_t in_stack_fffffffffffffcb4;
  ConfidentialTransactionController *in_stack_fffffffffffffcb8;
  ConfidentialTransactionController *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  string *in_stack_fffffffffffffd10;
  string local_2b0;
  string local_290;
  int64_t local_270;
  undefined1 local_268;
  Amount local_260;
  string local_250;
  allocator local_229;
  string local_228;
  Privkey local_208;
  ConfidentialAssetId local_1e8;
  BlindFactor local_1c0;
  BlindFactor local_1a0;
  ConfidentialValue local_180;
  allocator local_151;
  string local_150 [118];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  CfdSourceLocation local_b8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  char *local_50;
  char *local_48;
  char *local_40;
  int64_t *local_38;
  undefined8 *local_30;
  char *local_28;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x793;
    local_78.funcname = "CfdUnblindTxOut";
    cfd::core::logger::warn<>(&local_78,"tx is null or empty.");
    local_9a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to parameter. tx is null or empty.",&local_99);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               error_code,(string *)in_stack_fffffffffffffcc0);
    local_9a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_b8.filename = local_b8.filename + 1;
    local_b8.line = 0x799;
    local_b8.funcname = "CfdUnblindTxOut";
    cfd::core::logger::warn<>(&local_b8,"blinding key is null or empty.");
    local_da = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,"Failed to parameter. blinding key is null or empty.",&local_d9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               error_code,(string *)in_stack_fffffffffffffcc0);
    local_da = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,local_18,&local_151);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffffcc0,(string *)in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,local_28,&local_229);
  cfd::core::Privkey::Privkey(&local_208,&local_228,kMainnet,true);
  cfd::ConfidentialTransactionController::UnblindTxOut
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
  cfd::core::Privkey::~Privkey((Privkey *)0x5b6da6);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&local_1e8);
  if (!bVar1) {
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_250,&local_1e8);
      local_40 = cfd::capi::CreateString(in_stack_fffffffffffffd10);
      std::__cxx11::string::~string((string *)&local_250);
    }
    if (local_38 != (int64_t *)0x0) {
      AVar4 = cfd::core::ConfidentialValue::GetAmount(&local_180);
      local_270 = AVar4.amount_;
      local_268 = AVar4.ignore_check_;
      local_260.amount_ = local_270;
      local_260.ignore_check_ = (bool)local_268;
      iVar3 = cfd::core::Amount::GetSatoshiValue(&local_260);
      *local_38 = iVar3;
    }
    if (in_stack_00000008 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_290,&local_1c0);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffd10);
      std::__cxx11::string::~string((string *)&local_290);
    }
    if (in_stack_00000010 != (undefined8 *)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_2b0,&local_1a0);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffffd10);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
  }
  if (local_40 != (char *)0x0) {
    *local_30 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *in_stack_00000008 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000010 = local_50;
  }
  local_4 = 0;
  cfd::core::UnblindParameter::~UnblindParameter
            ((UnblindParameter *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  return local_4;
}

Assistant:

int CfdUnblindTxOut(
    void* handle, const char* tx_hex_string, uint32_t tx_out_index,
    const char* blinding_key, char** asset, int64_t* value,
    char** asset_blind_factor, char** value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(blinding_key)) {
      warn(CFD_LOG_SOURCE, "blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    UnblindParameter unblind_data =
        ctxc.UnblindTxOut(tx_out_index, Privkey(blinding_key));

    if (!unblind_data.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_data.asset.GetHex());
      }
      if (value != nullptr) {
        *value = unblind_data.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_data.abf.GetHex());
      }
      if (value_blind_factor != nullptr) {
        work_value_blind_factor = CreateString(unblind_data.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}